

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O0

void anon_unknown.dwarf_1ec8eb::writeCopyRead
               (string *tempDir,int w,int h,int xs,int ys,int dx,int dy)

{
  int rmode;
  int comp;
  string filename2;
  string filename1;
  int in_stack_00000458;
  int in_stack_0000045c;
  int in_stack_00000460;
  int in_stack_00000464;
  char *in_stack_00000468;
  char *in_stack_00000470;
  int in_stack_00000480;
  int in_stack_00000488;
  Compression in_stack_00000490;
  LevelRoundingMode in_stack_00000498;
  int in_stack_000004c8;
  int in_stack_000004cc;
  int in_stack_000004d0;
  int in_stack_000004d4;
  char *in_stack_000004d8;
  char *in_stack_000004e0;
  int in_stack_000004f0;
  int in_stack_000004f8;
  int in_stack_000004fc;
  Compression in_stack_00000500;
  int in_stack_00000504;
  LevelRoundingMode in_stack_00000508;
  undefined4 in_stack_0000050c;
  char *in_stack_00000510;
  int in_stack_00000520;
  int in_stack_00000528;
  Compression in_stack_00000530;
  LevelRoundingMode in_stack_00000538;
  char *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  int local_84;
  int local_80;
  string local_70 [32];
  string local_50 [64];
  
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  for (local_80 = 0; local_80 < 10; local_80 = local_80 + 1) {
    for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      writeCopyReadONE(in_stack_00000470,in_stack_00000468,in_stack_00000464,in_stack_00000460,
                       in_stack_0000045c,in_stack_00000458,in_stack_00000480,in_stack_00000488,
                       in_stack_00000490,in_stack_00000498);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      writeCopyReadMIP(in_stack_000004e0,in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,
                       in_stack_000004cc,in_stack_000004c8,in_stack_000004f0,in_stack_000004f8,
                       in_stack_00000500,in_stack_00000508);
      std::__cxx11::string::c_str();
      std::__cxx11::string::c_str();
      writeCopyReadRIP(in_stack_00000510,(char *)CONCAT44(in_stack_0000050c,in_stack_00000508),
                       in_stack_00000504,in_stack_00000500,in_stack_000004fc,in_stack_000004f8,
                       in_stack_00000520,in_stack_00000528,in_stack_00000530,in_stack_00000538);
    }
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void
writeCopyRead (const std::string &tempDir, int w, int h, int xs, int ys, int dx, int dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
	for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
	{
	    writeCopyReadONE (filename1.c_str(), filename2.c_str(), w, h, xs, ys, dx, dy,
			      Compression (comp), LevelRoundingMode (rmode));

	    writeCopyReadMIP (filename1.c_str(), filename2.c_str(), w, h, xs, ys, dx, dy,
			      Compression (comp), LevelRoundingMode (rmode));
			      
	    writeCopyReadRIP (filename1.c_str(), filename2.c_str(), w, h, xs, ys, dx, dy,
			      Compression (comp), LevelRoundingMode (rmode));
	}
    }
}